

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockExpectedCall_callWithLongLongIntegerParameter_TestShell::createTest
          (TEST_MockExpectedCall_callWithLongLongIntegerParameter_TestShell *this)

{
  TEST_MockExpectedCall_callWithLongLongIntegerParameter_Test *this_00;
  
  this_00 = (TEST_MockExpectedCall_callWithLongLongIntegerParameter_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0xf8);
  TEST_MockExpectedCall_callWithLongLongIntegerParameter_Test::
  TEST_MockExpectedCall_callWithLongLongIntegerParameter_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, callWithLongLongIntegerParameter)
{
    const SimpleString paramName = "paramName";
    long long value = 777;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("long long int", call->getInputParameterType(paramName).asCharString());
    LONGLONGS_EQUAL(value, call->getInputParameter(paramName).getLongLongIntValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> long long int paramName: <777 (0x309)>", call->callToString().asCharString());
}